

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# src_common_keywords.cpp
# Opt level: O2

PGScanKeyword *
duckdb_libpgquery::ScanKeywordLookup(char *text,PGScanKeyword *keywords,int num_keywords)

{
  byte bVar1;
  undefined1 auVar2 [16];
  int iVar3;
  size_t sVar4;
  ulong uVar5;
  __uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true> __s2;
  ulong uVar6;
  long lVar7;
  PGScanKeyword *pPVar8;
  byte bVar9;
  PGScanKeyword *pPVar10;
  unique_ptr<char[],_std::default_delete<char[]>_> data;
  
  sVar4 = strlen(text);
  uVar5 = (long)((sVar4 << 0x20) + 0x100000000) >> 0x20;
  uVar6 = 0xffffffffffffffff;
  if (-1 < (long)uVar5) {
    uVar6 = uVar5;
  }
  __s2.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl = (__uniq_ptr_impl<char,_std::default_delete<char[]>_>)operator_new__(uVar6);
  uVar6 = 0;
  uVar5 = 0;
  if (0 < (int)sVar4) {
    uVar5 = sVar4 & 0xffffffff;
  }
  for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
    bVar1 = text[uVar6];
    bVar9 = bVar1 | 0x20;
    if (0x19 < (byte)(bVar1 + 0xbf)) {
      bVar9 = bVar1;
    }
    *(byte *)((long)__s2.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                    super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                    super__Head_base<0UL,_char_*,_false>._M_head_impl + uVar6) = bVar9;
  }
  *(char *)((long)__s2.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                  super__Head_base<0UL,_char_*,_false>._M_head_impl +
           ((long)(sVar4 << 0x20) >> 0x20)) = '\0';
  pPVar10 = keywords + (long)num_keywords + -1;
  data._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl = (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
                 (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
                 __s2.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                 super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                 super__Head_base<0UL,_char_*,_false>._M_head_impl;
  do {
    pPVar8 = keywords;
    if (pPVar10 < pPVar8) {
      pPVar8 = (PGScanKeyword *)0x0;
      goto LAB_01b17ea3;
    }
    auVar2._8_8_ = (long)pPVar10 - (long)pPVar8 >> 0x3f;
    auVar2._0_8_ = (long)pPVar10 - (long)pPVar8 >> 4;
    lVar7 = SUB168(auVar2 / SEXT816(2),0);
    iVar3 = strcmp(pPVar8[lVar7].name,
                   (char *)__s2.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                           super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                           super__Head_base<0UL,_char_*,_false>._M_head_impl);
    keywords = pPVar8 + lVar7 + 1;
    if (-1 < iVar3) {
      keywords = pPVar8;
      pPVar10 = pPVar8 + lVar7 + -1;
    }
  } while (iVar3 != 0);
  pPVar8 = pPVar8 + lVar7;
LAB_01b17ea3:
  std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr(&data);
  return pPVar8;
}

Assistant:

const PGScanKeyword *ScanKeywordLookup(const char *text, const PGScanKeyword *keywords, int num_keywords) {
	int len, i;
	const PGScanKeyword *low;
	const PGScanKeyword *high;

	len = strlen(text);
	auto data = std::unique_ptr<char[]>(new char[len + 1]);
	auto word = data.get();
	/* We assume all keywords are shorter than NAMEDATALEN. */

	/*
	 * Apply an ASCII-only downcasing.  We must not use tolower() since it may
	 * produce the wrong translation in some locales (eg, Turkish).
	 */
	for (i = 0; i < len; i++) {
		char ch = text[i];

		if (ch >= 'A' && ch <= 'Z')
			ch += 'a' - 'A';
		word[i] = ch;
	}
	word[len] = '\0';

	/*
	 * Now do a binary search using plain strcmp() comparison.
	 */
	low = keywords;
	high = keywords + (num_keywords - 1);
	while (low <= high) {
		const PGScanKeyword *middle;
		int difference;

		middle = low + (high - low) / 2;
		difference = strcmp(middle->name, word);
		if (difference == 0)
			return middle;
		else if (difference < 0)
			low = middle + 1;
		else
			high = middle - 1;
	}

	return NULL;
}